

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeBeginTrans(Btree *p,int wrflag)

{
  u32 uVar1;
  BtShared *pBt_00;
  Pager *pPager;
  MemPage *pMVar2;
  u8 uVar3;
  int iVar4;
  u32 uVar5;
  bool bVar6;
  MemPage *pPage1;
  BtLock *pIter;
  sqlite3 *pBlock;
  int rc;
  BtShared *pBt;
  int wrflag_local;
  Btree *p_local;
  
  pBt_00 = p->pBt;
  pBlock._4_4_ = 0;
  sqlite3BtreeEnter(p);
  if ((p->inTrans != '\x02') && ((p->inTrans != '\x01' || (wrflag != 0)))) {
    if (((pBt_00->btsFlags & 1) == 0) || (wrflag == 0)) {
      pIter = (BtLock *)0x0;
      if (((wrflag == 0) || (pBt_00->inTransaction != '\x02')) && ((pBt_00->btsFlags & 0x80) == 0))
      {
        if (1 < wrflag) {
          for (pPage1 = (MemPage *)pBt_00->pLock; pPage1 != (MemPage *)0x0;
              pPage1 = *(MemPage **)&pPage1->minLocal) {
            if (*(Btree **)pPage1 != p) {
              pIter = (BtLock *)**(undefined8 **)pPage1;
              break;
            }
          }
        }
      }
      else {
        pIter = (BtLock *)pBt_00->pWriter->db;
      }
      if (pIter == (BtLock *)0x0) {
        pBlock._4_4_ = querySharedCacheTableLock(p,1,'\x01');
        if (pBlock._4_4_ == 0) {
          pBt_00->btsFlags = pBt_00->btsFlags & 0xffef;
          if (pBt_00->nPage == 0) {
            pBt_00->btsFlags = pBt_00->btsFlags | 0x10;
          }
          do {
            do {
              bVar6 = false;
              if (pBt_00->pPage1 == (MemPage *)0x0) {
                pBlock._4_4_ = lockBtree(pBt_00);
                bVar6 = pBlock._4_4_ == 0;
              }
            } while (bVar6);
            if ((pBlock._4_4_ == 0) && (wrflag != 0)) {
              if ((pBt_00->btsFlags & 1) == 0) {
                pPager = pBt_00->pPager;
                iVar4 = sqlite3TempInMemory(p->db);
                pBlock._4_4_ = sqlite3PagerBegin(pPager,(uint)(1 < wrflag),iVar4);
                if (pBlock._4_4_ == 0) {
                  pBlock._4_4_ = newDatabase(pBt_00);
                }
              }
              else {
                pBlock._4_4_ = 8;
              }
            }
            if (pBlock._4_4_ != 0) {
              unlockBtreeIfUnused(pBt_00);
            }
            bVar6 = false;
            if (((pBlock._4_4_ & 0xff) == 5) && (bVar6 = false, pBt_00->inTransaction == '\0')) {
              iVar4 = btreeInvokeBusyHandler(pBt_00);
              bVar6 = iVar4 != 0;
            }
          } while (bVar6);
          if (pBlock._4_4_ == 0) {
            if ((p->inTrans == '\0') &&
               (pBt_00->nTransaction = pBt_00->nTransaction + 1, p->sharable != '\0')) {
              (p->lock).eLock = '\x01';
              (p->lock).pNext = pBt_00->pLock;
              pBt_00->pLock = &p->lock;
            }
            uVar3 = '\x01';
            if (wrflag != 0) {
              uVar3 = '\x02';
            }
            p->inTrans = uVar3;
            if (pBt_00->inTransaction < p->inTrans) {
              pBt_00->inTransaction = p->inTrans;
            }
            if (wrflag != 0) {
              pMVar2 = pBt_00->pPage1;
              pBt_00->pWriter = p;
              pBt_00->btsFlags = pBt_00->btsFlags & 0xffbf;
              if (1 < wrflag) {
                pBt_00->btsFlags = pBt_00->btsFlags | 0x40;
              }
              uVar1 = pBt_00->nPage;
              uVar5 = sqlite3Get4byte(pMVar2->aData + 0x1c);
              if ((uVar1 != uVar5) &&
                 (pBlock._4_4_ = sqlite3PagerWrite(pMVar2->pDbPage), pBlock._4_4_ == 0)) {
                sqlite3Put4byte(pMVar2->aData + 0x1c,pBt_00->nPage);
              }
            }
          }
        }
      }
      else {
        pBlock._4_4_ = 0x106;
      }
    }
    else {
      pBlock._4_4_ = 8;
    }
  }
  if ((pBlock._4_4_ == 0) && (wrflag != 0)) {
    pBlock._4_4_ = sqlite3PagerOpenSavepoint(pBt_00->pPager,p->db->nSavepoint);
  }
  sqlite3BtreeLeave(p);
  return pBlock._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeBeginTrans(Btree *p, int wrflag){
  BtShared *pBt = p->pBt;
  int rc = SQLITE_OK;

  sqlite3BtreeEnter(p);
  btreeIntegrity(p);

  /* If the btree is already in a write-transaction, or it
  ** is already in a read-transaction and a read-transaction
  ** is requested, this is a no-op.
  */
  if( p->inTrans==TRANS_WRITE || (p->inTrans==TRANS_READ && !wrflag) ){
    goto trans_begun;
  }
  assert( pBt->inTransaction==TRANS_WRITE || IfNotOmitAV(pBt->bDoTruncate)==0 );

  /* Write transactions are not possible on a read-only database */
  if( (pBt->btsFlags & BTS_READ_ONLY)!=0 && wrflag ){
    rc = SQLITE_READONLY;
    goto trans_begun;
  }

#ifndef SQLITE_OMIT_SHARED_CACHE
  {
    sqlite3 *pBlock = 0;
    /* If another database handle has already opened a write transaction 
    ** on this shared-btree structure and a second write transaction is
    ** requested, return SQLITE_LOCKED.
    */
    if( (wrflag && pBt->inTransaction==TRANS_WRITE)
     || (pBt->btsFlags & BTS_PENDING)!=0
    ){
      pBlock = pBt->pWriter->db;
    }else if( wrflag>1 ){
      BtLock *pIter;
      for(pIter=pBt->pLock; pIter; pIter=pIter->pNext){
        if( pIter->pBtree!=p ){
          pBlock = pIter->pBtree->db;
          break;
        }
      }
    }
    if( pBlock ){
      sqlite3ConnectionBlocked(p->db, pBlock);
      rc = SQLITE_LOCKED_SHAREDCACHE;
      goto trans_begun;
    }
  }
#endif

  /* Any read-only or read-write transaction implies a read-lock on 
  ** page 1. So if some other shared-cache client already has a write-lock 
  ** on page 1, the transaction cannot be opened. */
  rc = querySharedCacheTableLock(p, MASTER_ROOT, READ_LOCK);
  if( SQLITE_OK!=rc ) goto trans_begun;

  pBt->btsFlags &= ~BTS_INITIALLY_EMPTY;
  if( pBt->nPage==0 ) pBt->btsFlags |= BTS_INITIALLY_EMPTY;
  do {
    /* Call lockBtree() until either pBt->pPage1 is populated or
    ** lockBtree() returns something other than SQLITE_OK. lockBtree()
    ** may return SQLITE_OK but leave pBt->pPage1 set to 0 if after
    ** reading page 1 it discovers that the page-size of the database 
    ** file is not pBt->pageSize. In this case lockBtree() will update
    ** pBt->pageSize to the page-size of the file on disk.
    */
    while( pBt->pPage1==0 && SQLITE_OK==(rc = lockBtree(pBt)) );

    if( rc==SQLITE_OK && wrflag ){
      if( (pBt->btsFlags & BTS_READ_ONLY)!=0 ){
        rc = SQLITE_READONLY;
      }else{
        rc = sqlite3PagerBegin(pBt->pPager,wrflag>1,sqlite3TempInMemory(p->db));
        if( rc==SQLITE_OK ){
          rc = newDatabase(pBt);
        }
      }
    }
  
    if( rc!=SQLITE_OK ){
      unlockBtreeIfUnused(pBt);
    }
  }while( (rc&0xFF)==SQLITE_BUSY && pBt->inTransaction==TRANS_NONE &&
          btreeInvokeBusyHandler(pBt) );

  if( rc==SQLITE_OK ){
    if( p->inTrans==TRANS_NONE ){
      pBt->nTransaction++;
#ifndef SQLITE_OMIT_SHARED_CACHE
      if( p->sharable ){
        assert( p->lock.pBtree==p && p->lock.iTable==1 );
        p->lock.eLock = READ_LOCK;
        p->lock.pNext = pBt->pLock;
        pBt->pLock = &p->lock;
      }
#endif
    }
    p->inTrans = (wrflag?TRANS_WRITE:TRANS_READ);
    if( p->inTrans>pBt->inTransaction ){
      pBt->inTransaction = p->inTrans;
    }
    if( wrflag ){
      MemPage *pPage1 = pBt->pPage1;
#ifndef SQLITE_OMIT_SHARED_CACHE
      assert( !pBt->pWriter );
      pBt->pWriter = p;
      pBt->btsFlags &= ~BTS_EXCLUSIVE;
      if( wrflag>1 ) pBt->btsFlags |= BTS_EXCLUSIVE;
#endif

      /* If the db-size header field is incorrect (as it may be if an old
      ** client has been writing the database file), update it now. Doing
      ** this sooner rather than later means the database size can safely 
      ** re-read the database size from page 1 if a savepoint or transaction
      ** rollback occurs within the transaction.
      */
      if( pBt->nPage!=get4byte(&pPage1->aData[28]) ){
        rc = sqlite3PagerWrite(pPage1->pDbPage);
        if( rc==SQLITE_OK ){
          put4byte(&pPage1->aData[28], pBt->nPage);
        }
      }
    }
  }


trans_begun:
  if( rc==SQLITE_OK && wrflag ){
    /* This call makes sure that the pager has the correct number of
    ** open savepoints. If the second parameter is greater than 0 and
    ** the sub-journal is not already open, then it will be opened here.
    */
    rc = sqlite3PagerOpenSavepoint(pBt->pPager, p->db->nSavepoint);
  }

  btreeIntegrity(p);
  sqlite3BtreeLeave(p);
  return rc;
}